

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

uint8_t NearLosslessComponent(uint8_t value,uint8_t predict,uint8_t boundary,int quantization)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int bias;
  int upper;
  int lower;
  int boundary_residual;
  int residual;
  int quantization_local;
  uint8_t boundary_local;
  uint8_t predict_local;
  uint8_t value_local;
  uint8_t local_1;
  
  uVar2 = (uint)value - (uint)predict & 0xff;
  uVar3 = (uint)boundary - (uint)predict & 0xff;
  uVar4 = uVar2 & (quantization - 1U ^ 0xffffffff);
  iVar5 = uVar4 + quantization;
  cVar1 = (char)(quantization >> 1);
  local_1 = (uint8_t)uVar4;
  if ((int)(uVar2 - uVar4) <
      (int)((iVar5 - uVar2) + (uint)(((uint)boundary - (uint)value & 0xff) < uVar3))) {
    if ((uVar3 < uVar2) && (uVar4 <= uVar3)) {
      local_1 = local_1 + cVar1;
    }
  }
  else if ((uVar3 < uVar2) || (iVar5 <= (int)uVar3)) {
    local_1 = (uint8_t)iVar5;
  }
  else {
    local_1 = local_1 + cVar1;
  }
  return local_1;
}

Assistant:

static uint8_t NearLosslessComponent(uint8_t value, uint8_t predict,
                                     uint8_t boundary, int quantization) {
  const int residual = (value - predict) & 0xff;
  const int boundary_residual = (boundary - predict) & 0xff;
  const int lower = residual & ~(quantization - 1);
  const int upper = lower + quantization;
  // Resolve ties towards a value closer to the prediction (i.e. towards lower
  // if value comes after prediction and towards upper otherwise).
  const int bias = ((boundary - value) & 0xff) < boundary_residual;
  if (residual - lower < upper - residual + bias) {
    // lower is closer to residual than upper.
    if (residual > boundary_residual && lower <= boundary_residual) {
      // Halve quantization step to avoid crossing boundary. This midpoint is
      // on the same side of boundary as residual because midpoint >= residual
      // (since lower is closer than upper) and residual is above the boundary.
      return lower + (quantization >> 1);
    }
    return lower;
  } else {
    // upper is closer to residual than lower.
    if (residual <= boundary_residual && upper > boundary_residual) {
      // Halve quantization step to avoid crossing boundary. This midpoint is
      // on the same side of boundary as residual because midpoint <= residual
      // (since upper is closer than lower) and residual is below the boundary.
      return lower + (quantization >> 1);
    }
    return upper & 0xff;
  }
}